

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

bool IsReachableLoadValue(VmInstruction *user,VmInstruction *load)

{
  VmInstructionType VVar1;
  VariableData *container;
  bool bVar2;
  byte in_CL;
  byte bVar3;
  VmValue *pVVar4;
  VmInstruction *storeInst;
  bool bVar5;
  
  if (user->parent == load->parent) {
    if ((load->arguments).count == 0) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    pVVar4 = *(load->arguments).data;
    if ((pVVar4 == (VmValue *)0x0) || (pVVar4->typeID != 1)) {
      pVVar4 = (VmValue *)0x0;
    }
    storeInst = user->prevSibling;
    bVar5 = storeInst == load;
    if (!bVar5) {
      do {
        VVar1 = storeInst->cmd;
        if (VVar1 - VM_INST_STORE_BYTE < 7) {
          bVar2 = anon_unknown.dwarf_10d873::IsLoadAliasedWithStore(load,storeInst);
          if (bVar2) break;
        }
        else {
          if (VVar1 - VM_INST_SET_RANGE < 2) break;
          if (VVar1 == VM_INST_CALL) {
            if ((pVVar4 != (VmValue *)0x0) &&
               (container = (VariableData *)pVVar4[1].comment.end, container != (VariableData *)0x0)
               ) {
              bVar2 = HasAddressTaken(container);
              in_CL = 1;
              if (!bVar2) goto LAB_001a7ef2;
            }
            break;
          }
        }
        storeInst = storeInst->prevSibling;
        bVar5 = storeInst == load;
      } while (!bVar5);
      in_CL = 0;
    }
LAB_001a7ef2:
    bVar3 = bVar5 | in_CL;
  }
  else {
    bVar3 = 0;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool IsReachableLoadValue(VmInstruction *user, VmInstruction *load)
{
	if(user->parent != load->parent)
		return false;

	VmValue *loadAddress = load->arguments[0];

	VmConstant *loadAddressConstant = getType<VmConstant>(loadAddress);

	for(VmInstruction *curr = user->prevSibling; curr != load; curr = curr->prevSibling)
	{
		switch(curr->cmd)
		{
		case VM_INST_STORE_BYTE:
		case VM_INST_STORE_SHORT:
		case VM_INST_STORE_INT:
		case VM_INST_STORE_FLOAT:
		case VM_INST_STORE_DOUBLE:
		case VM_INST_STORE_LONG:
		case VM_INST_STORE_STRUCT:
			if(IsLoadAliasedWithStore(load, curr))
				return false;
			break;
		case VM_INST_SET_RANGE:
		case VM_INST_MEM_COPY:
			return false;
		case VM_INST_CALL:
			if(loadAddressConstant && loadAddressConstant->container && !HasAddressTaken(loadAddressConstant->container))
				return true;

			return false;
		default:
			break;
		}
	}

	return true;
}